

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressSequences_internal
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t srcSize)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ZSTD_sequenceCopier p_Var4;
  size_t sVar5;
  ulong srcSize_00;
  uint local_d8;
  U32 cBlockHeader;
  size_t err_code_4;
  size_t err_code_3;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  size_t additionalByteAdjustment;
  size_t cBlockSize;
  U32 cBlockHeader24;
  ZSTD_sequenceCopier sequenceCopier;
  BYTE *op;
  BYTE *ip;
  ZSTD_sequencePosition seqPos;
  size_t remaining;
  size_t compressedSeqsSize;
  size_t blockSize;
  size_t sStack_48;
  U32 lastBlock;
  size_t cSize;
  void *src_local;
  size_t inSeqsSize_local;
  ZSTD_Sequence *inSeqs_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_CCtx *cctx_local;
  
  sStack_48 = 0;
  seqPos.posInSrc = srcSize;
  memset(&ip,0,0x10);
  p_Var4 = ZSTD_selectSequenceCopier((cctx->appliedParams).blockDelimiters);
  sequenceCopier = (ZSTD_sequenceCopier)dst;
  op = (BYTE *)src;
  inSeqs_local = (ZSTD_Sequence *)dstCapacity;
  if (seqPos.posInSrc == 0) {
    if (dstCapacity < 4) {
      return 0xffffffffffffffba;
    }
    MEM_writeLE32(dst,1);
    sequenceCopier = (ZSTD_sequenceCopier)((long)dst + 3);
    inSeqs_local = (ZSTD_Sequence *)(dstCapacity - 3);
    sStack_48 = 3;
  }
  do {
    while( true ) {
      if (seqPos.posInSrc == 0) {
        return sStack_48;
      }
      uVar2 = (uint)(seqPos.posInSrc <= cctx->blockSize);
      if (uVar2 == 0) {
        local_d8 = (uint)cctx->blockSize;
      }
      else {
        local_d8 = (uint)seqPos.posInSrc;
      }
      ZSTD_resetSeqStore(&cctx->seqStore);
      sVar5 = (*p_Var4)(cctx,(ZSTD_sequencePosition *)&ip,inSeqs,inSeqsSize,op,(ulong)local_d8);
      uVar1 = ERR_isError(sVar5);
      if (uVar1 != 0) {
        return sVar5;
      }
      srcSize_00 = local_d8 - sVar5;
      if (6 < srcSize_00) break;
      sVar5 = ZSTD_noCompressBlock(sequenceCopier,(size_t)inSeqs_local,op,srcSize_00,uVar2);
      uVar2 = ERR_isError(sVar5);
      if (uVar2 != 0) {
        return sVar5;
      }
      sStack_48 = sStack_48 + sVar5;
      op = op + srcSize_00;
      sequenceCopier = sequenceCopier + sVar5;
      seqPos.posInSrc = seqPos.posInSrc - srcSize_00;
      inSeqs_local = (ZSTD_Sequence *)((long)inSeqs_local - sVar5);
    }
    remaining = ZSTD_entropyCompressSeqStore
                          (&cctx->seqStore,&((cctx->blockState).prevCBlock)->entropy,
                           &((cctx->blockState).nextCBlock)->entropy,&cctx->appliedParams,
                           sequenceCopier + 3,(size_t)((long)&inSeqs_local[-1].rep + 1),srcSize_00,
                           cctx->entropyWorkspace,0x19d8,cctx->bmi2);
    uVar1 = ERR_isError(remaining);
    if (uVar1 != 0) {
      return remaining;
    }
    if (((cctx->isFirstBlock == 0) && (iVar3 = ZSTD_maybeRLE(&cctx->seqStore), iVar3 != 0)) &&
       (iVar3 = ZSTD_isRLE((BYTE *)src,srcSize), iVar3 != 0)) {
      remaining = 1;
    }
    if (remaining == 0) {
      additionalByteAdjustment =
           ZSTD_noCompressBlock(sequenceCopier,(size_t)inSeqs_local,op,srcSize_00,uVar2);
      uVar1 = ERR_isError(additionalByteAdjustment);
joined_r0x00243582:
      if (uVar1 != 0) {
        return additionalByteAdjustment;
      }
    }
    else {
      if (remaining == 1) {
        additionalByteAdjustment =
             ZSTD_rleCompressBlock(sequenceCopier,(size_t)inSeqs_local,*op,srcSize_00,uVar2);
        uVar1 = ERR_isError(additionalByteAdjustment);
        goto joined_r0x00243582;
      }
      ZSTD_blockState_confirmRepcodesAndEntropyTables(&cctx->blockState);
      if ((((cctx->blockState).prevCBlock)->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
        (((cctx->blockState).prevCBlock)->entropy).fse.offcode_repeatMode = FSE_repeat_check;
      }
      MEM_writeLE24(sequenceCopier,uVar2 + 4 + (int)(remaining << 3));
      additionalByteAdjustment = remaining + 3;
    }
    sStack_48 = sStack_48 + additionalByteAdjustment;
    if (uVar2 != 0) {
      return sStack_48;
    }
    op = op + srcSize_00;
    sequenceCopier = sequenceCopier + additionalByteAdjustment;
    seqPos.posInSrc = seqPos.posInSrc - srcSize_00;
    inSeqs_local = (ZSTD_Sequence *)((long)inSeqs_local - additionalByteAdjustment);
    cctx->isFirstBlock = 0;
  } while( true );
}

Assistant:

static size_t ZSTD_compressSequences_internal(ZSTD_CCtx* cctx,
                                              void* dst, size_t dstCapacity,
                                              const ZSTD_Sequence* inSeqs, size_t inSeqsSize,
                                              const void* src, size_t srcSize) {
    size_t cSize = 0;
    U32 lastBlock;
    size_t blockSize;
    size_t compressedSeqsSize;
    size_t remaining = srcSize;
    ZSTD_sequencePosition seqPos = {0, 0, 0};

    BYTE const* ip = (BYTE const*)src;
    BYTE* op = (BYTE*)dst;
    ZSTD_sequenceCopier sequenceCopier = ZSTD_selectSequenceCopier(cctx->appliedParams.blockDelimiters);

    DEBUGLOG(4, "ZSTD_compressSequences_internal srcSize: %zu, inSeqsSize: %zu", srcSize, inSeqsSize);
    /* Special case: empty frame */
    if (remaining == 0) {
        U32 const cBlockHeader24 = 1 /* last block */ + (((U32)bt_raw)<<1);
        RETURN_ERROR_IF(dstCapacity<4, dstSize_tooSmall, "No room for empty frame block header");
        MEM_writeLE32(op, cBlockHeader24);
        op += ZSTD_blockHeaderSize;
        dstCapacity -= ZSTD_blockHeaderSize;
        cSize += ZSTD_blockHeaderSize;
    }

    while (remaining) {
        size_t cBlockSize;
        size_t additionalByteAdjustment;
        lastBlock = remaining <= cctx->blockSize;
        blockSize = lastBlock ? (U32)remaining : (U32)cctx->blockSize;
        ZSTD_resetSeqStore(&cctx->seqStore);
        DEBUGLOG(4, "Working on new block. Blocksize: %zu", blockSize);

        additionalByteAdjustment = sequenceCopier(cctx, &seqPos, inSeqs, inSeqsSize, ip, blockSize);
        FORWARD_IF_ERROR(additionalByteAdjustment, "Bad sequence copy");
        blockSize -= additionalByteAdjustment;

        /* If blocks are too small, emit as a nocompress block */
        if (blockSize < MIN_CBLOCK_SIZE+ZSTD_blockHeaderSize+1) {
            cBlockSize = ZSTD_noCompressBlock(op, dstCapacity, ip, blockSize, lastBlock);
            FORWARD_IF_ERROR(cBlockSize, "Nocompress block failed");
            DEBUGLOG(4, "Block too small, writing out nocompress block: cSize: %zu", cBlockSize);
            cSize += cBlockSize;
            ip += blockSize;
            op += cBlockSize;
            remaining -= blockSize;
            dstCapacity -= cBlockSize;
            continue;
        }

        compressedSeqsSize = ZSTD_entropyCompressSeqStore(&cctx->seqStore,
                                &cctx->blockState.prevCBlock->entropy, &cctx->blockState.nextCBlock->entropy,
                                &cctx->appliedParams,
                                op + ZSTD_blockHeaderSize /* Leave space for block header */, dstCapacity - ZSTD_blockHeaderSize,
                                blockSize,
                                cctx->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */,
                                cctx->bmi2);
        FORWARD_IF_ERROR(compressedSeqsSize, "Compressing sequences of block failed");
        DEBUGLOG(4, "Compressed sequences size: %zu", compressedSeqsSize);

        if (!cctx->isFirstBlock &&
            ZSTD_maybeRLE(&cctx->seqStore) &&
            ZSTD_isRLE((BYTE const*)src, srcSize)) {
            /* We don't want to emit our first block as a RLE even if it qualifies because
            * doing so will cause the decoder (cli only) to throw a "should consume all input error."
            * This is only an issue for zstd <= v1.4.3
            */
            compressedSeqsSize = 1;
        }

        if (compressedSeqsSize == 0) {
            /* ZSTD_noCompressBlock writes the block header as well */
            cBlockSize = ZSTD_noCompressBlock(op, dstCapacity, ip, blockSize, lastBlock);
            FORWARD_IF_ERROR(cBlockSize, "Nocompress block failed");
            DEBUGLOG(4, "Writing out nocompress block, size: %zu", cBlockSize);
        } else if (compressedSeqsSize == 1) {
            cBlockSize = ZSTD_rleCompressBlock(op, dstCapacity, *ip, blockSize, lastBlock);
            FORWARD_IF_ERROR(cBlockSize, "RLE compress block failed");
            DEBUGLOG(4, "Writing out RLE block, size: %zu", cBlockSize);
        } else {
            U32 cBlockHeader;
            /* Error checking and repcodes update */
            ZSTD_blockState_confirmRepcodesAndEntropyTables(&cctx->blockState);
            if (cctx->blockState.prevCBlock->entropy.fse.offcode_repeatMode == FSE_repeat_valid)
                cctx->blockState.prevCBlock->entropy.fse.offcode_repeatMode = FSE_repeat_check;

            /* Write block header into beginning of block*/
            cBlockHeader = lastBlock + (((U32)bt_compressed)<<1) + (U32)(compressedSeqsSize << 3);
            MEM_writeLE24(op, cBlockHeader);
            cBlockSize = ZSTD_blockHeaderSize + compressedSeqsSize;
            DEBUGLOG(4, "Writing out compressed block, size: %zu", cBlockSize);
        }

        cSize += cBlockSize;
        DEBUGLOG(4, "cSize running total: %zu", cSize);

        if (lastBlock) {
            break;
        } else {
            ip += blockSize;
            op += cBlockSize;
            remaining -= blockSize;
            dstCapacity -= cBlockSize;
            cctx->isFirstBlock = 0;
        }
    }

    return cSize;
}